

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void login_log(CHAR_DATA *ch,int type)

{
  ulong uVar1;
  char *pcVar2;
  time_t tVar3;
  char *pcVar4;
  int in_ESI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var5;
  char query [4608];
  char *escape;
  undefined4 in_stack_ffffffffffffed64;
  int local_127c;
  int local_1274;
  long local_1268;
  char *local_1238;
  char local_1228 [4488];
  char *in_stack_ffffffffffffff60;
  
  if (((in_RDI->pcdata->host != (char *)0x0) || (in_RDI->desc != (DESCRIPTOR_DATA *)0x0)) &&
     (uVar1 = in_RDI->comm[0], _Var5 = std::pow<int,int>(0,0x52a28a), (uVar1 & (long)_Var5) == 0)) {
    if (in_RDI->pcdata->host == (char *)0x0) {
      local_1238 = escape_string(in_stack_ffffffffffffff60);
    }
    else {
      local_1238 = escape_string(in_stack_ffffffffffffff60);
    }
    pcVar2 = in_RDI->true_name;
    pcVar4 = log_time();
    tVar3 = current_time;
    if (in_ESI == 2) {
      local_1268 = (current_time - in_RDI->logon) / 0x3c;
    }
    else {
      local_1268 = -1;
    }
    if (in_ESI < 1) {
      local_1274 = -1;
      local_127c = -1;
    }
    else {
      local_1274 = count_carried(in_RDI,false);
      local_127c = count_carried(in_RDI,true);
    }
    sprintf(local_1228,
            "INSERT INTO logins VALUES(\'%s\', \'%s\', \'%s\', \'%ld\', \'%ld\', \'%d\', \'%d\', \'%d\')"
            ,pcVar2,local_1238,pcVar4,tVar3,local_1268,local_1274,local_127c,in_ESI);
    one_query((char *)CONCAT44(in_stack_ffffffffffffed64,local_1274));
  }
  return;
}

Assistant:

void login_log(CHAR_DATA *ch, int type)
{
	if (!ch->pcdata->host && !ch->desc)
		return;

	if (IS_SET(ch->comm, COMM_NOSOCKET))
		return;

	auto escape = ch->pcdata->host
					  ? escape_string(ch->pcdata->host)
					  : escape_string(ch->desc->host);

	char query[MAX_STRING_LENGTH];
	sprintf(query, "INSERT INTO logins VALUES('%s', '%s', '%s', '%ld', '%ld', '%d', '%d', '%d')",
			ch->true_name,
			escape,
			log_time(),
			current_time,
			type == 2 ? ((current_time - ch->logon) / 60) : -1,
			type > 0 ? count_carried(ch, false) : -1, type > 0 ? count_carried(ch, true) : -1,
			type);

	one_query(query);
}